

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWISimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
AtmelSWISimulationDataGenerator::CreateSWITransaction
          (AtmelSWISimulationDataGenerator *this,U8 *BlockSent,U8 *BlockReceived)

{
  uint uVar1;
  ulong uVar2;
  
  OutputTokenWake(this);
  OutputFlag(this,SWIF_Transmit);
  if (StatusBlock[0] != '\0') {
    uVar2 = 0;
    do {
      OutputByte(this,StatusBlock[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < StatusBlock[0]);
  }
  uVar1 = (int)this + 0x18;
  ClockGenerator::AdvanceByTimeS(0.001);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  OutputFlag(this,SWIF_Command);
  if (*BlockSent != '\0') {
    uVar2 = 0;
    do {
      OutputByte(this,BlockSent[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < *BlockSent);
  }
  ClockGenerator::AdvanceByTimeS(0.014);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  OutputFlag(this,SWIF_Transmit);
  if (*BlockReceived != '\0') {
    uVar2 = 0;
    do {
      OutputByte(this,BlockReceived[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < *BlockReceived);
  }
  ClockGenerator::AdvanceByTimeS(0.01);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  OutputFlag(this,SWIF_Idle);
  ClockGenerator::AdvanceByTimeS(0.1);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  return;
}

Assistant:

void AtmelSWISimulationDataGenerator::CreateSWITransaction( U8 BlockSent[], U8 BlockReceived[] )
{
    // wake
    OutputTokenWake();

    // get the status
    OutputFlag( SWIF_Transmit );
    OutputIOBlock( StatusBlock );

    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MILLI_SEC * 1 ) );

    // send the command
    OutputFlag( SWIF_Command );
    OutputIOBlock( BlockSent );
    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MILLI_SEC * 14 ) );

    // get the response
    OutputFlag( SWIF_Transmit );
    OutputIOBlock( BlockReceived );

    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MILLI_SEC * 10 ) );

    // add the idle flag
    OutputFlag( SWIF_Idle );

    // make a gap
    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MILLI_SEC * 100 ) );
}